

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::CheckFPRoundingModeForShaders
          (ValidationState_t *vstate,Instruction *inst,Decoration *decoration)

{
  Instruction *pIVar1;
  bool bVar2;
  Op OVar3;
  uint uVar4;
  uint32_t uVar5;
  DiagnosticStream *pDVar6;
  spv_const_context psVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  const_reference pvVar8;
  vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
  *this_00;
  DiagnosticStream local_ba8;
  StorageClass local_9cc;
  undefined1 local_9c8 [4];
  StorageClass storage;
  uint32_t local_7ec;
  Instruction *pIStack_7e8;
  uint half_float_id;
  Instruction *ptr_type;
  Instruction *ptr_inst;
  DiagnosticStream local_600;
  Instruction *local_428;
  Instruction *store;
  pair<const_spvtools::val::Instruction_*,_unsigned_int> *use;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
  *__range2;
  DiagnosticStream local_3e0;
  value_type local_204;
  undefined1 local_200 [4];
  FPRoundingMode mode;
  Decoration *local_28;
  Decoration *decoration_local;
  Instruction *inst_local;
  ValidationState_t *vstate_local;
  
  local_28 = decoration;
  decoration_local = (Decoration *)inst;
  inst_local = (Instruction *)vstate;
  OVar3 = Instruction::opcode(inst);
  if (OVar3 == OpFConvert) {
    psVar7 = ValidationState_t::context((ValidationState_t *)inst_local);
    bVar2 = spvIsVulkanEnv(psVar7->target_env);
    if (bVar2) {
      this = Decoration::params(local_28);
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this,0);
      local_204 = *pvVar8;
      if ((local_204 != 0) && (local_204 != 1)) {
        ValidationState_t::diag
                  (&local_3e0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                   (Instruction *)decoration_local);
        ValidationState_t::VkErrorID_abi_cxx11_
                  ((string *)&__range2,(ValidationState_t *)inst_local,0x1243,(char *)0x0);
        pDVar6 = DiagnosticStream::operator<<
                           (&local_3e0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &__range2);
        pDVar6 = DiagnosticStream::operator<<
                           (pDVar6,(char (*) [60])
                                   "In Vulkan, the FPRoundingMode mode must only by RTE or RTZ.");
        vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
        std::__cxx11::string::~string((string *)&__range2);
        DiagnosticStream::~DiagnosticStream(&local_3e0);
        return vstate_local._4_4_;
      }
    }
    this_00 = Instruction::uses((Instruction *)decoration_local);
    __end2 = std::
             vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
             ::begin(this_00);
    use = (pair<const_spvtools::val::Instruction_*,_unsigned_int> *)
          std::
          vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
          ::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
                                       *)&use), bVar2) {
      store = (Instruction *)
              __gnu_cxx::
              __normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
              ::operator*(&__end2);
      local_428 = (Instruction *)
                  (store->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      OVar3 = Instruction::opcode(local_428);
      if (OVar3 != OpFConvert) {
        OVar3 = Instruction::opcode(local_428);
        bVar2 = spvOpcodeIsDebug(OVar3);
        if ((!bVar2) && (bVar2 = Instruction::IsNonSemantic(local_428), !bVar2)) {
          OVar3 = Instruction::opcode(local_428);
          bVar2 = spvOpcodeIsDecoration(OVar3);
          if (!bVar2) {
            OVar3 = Instruction::opcode(local_428);
            pIVar1 = inst_local;
            if (OVar3 != OpStore) {
              ValidationState_t::diag
                        (&local_600,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                         (Instruction *)decoration_local);
              pDVar6 = DiagnosticStream::operator<<
                                 (&local_600,
                                  (char (*) [83])
                                  "FPRoundingMode decoration can be applied only to the Object operand of an OpStore."
                                 );
              vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
              DiagnosticStream::~DiagnosticStream(&local_600);
              return vstate_local._4_4_;
            }
            if (*(int *)&(store->words_).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish != 2) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&ptr_inst,(ValidationState_t *)inst_local,
                         SPV_ERROR_INVALID_ID,(Instruction *)decoration_local);
              pDVar6 = DiagnosticStream::operator<<
                                 ((DiagnosticStream *)&ptr_inst,
                                  (char (*) [83])
                                  "FPRoundingMode decoration can be applied only to the Object operand of an OpStore."
                                 );
              vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&ptr_inst);
              return vstate_local._4_4_;
            }
            uVar4 = Instruction::GetOperandAs<unsigned_int>(local_428,0);
            ptr_type = ValidationState_t::FindDef((ValidationState_t *)pIVar1,uVar4);
            pIVar1 = inst_local;
            uVar4 = Instruction::GetOperandAs<unsigned_int>(ptr_type,0);
            pIStack_7e8 = ValidationState_t::FindDef((ValidationState_t *)pIVar1,uVar4);
            local_7ec = Instruction::GetOperandAs<unsigned_int>(pIStack_7e8,2);
            bVar2 = ValidationState_t::IsFloatScalarOrVectorType
                              ((ValidationState_t *)inst_local,local_7ec);
            if ((!bVar2) ||
               (uVar5 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_7ec),
               uVar5 != 0x10)) {
              ValidationState_t::diag
                        ((DiagnosticStream *)local_9c8,(ValidationState_t *)inst_local,
                         SPV_ERROR_INVALID_ID,(Instruction *)decoration_local);
              pDVar6 = DiagnosticStream::operator<<
                                 ((DiagnosticStream *)local_9c8,
                                  (char (*) [160])
                                  "FPRoundingMode decoration can be applied only to the Object operand of an OpStore storing through a pointer to a 16-bit floating-point scalar or vector object."
                                 );
              vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_9c8);
              return vstate_local._4_4_;
            }
            local_9cc = Instruction::GetOperandAs<spv::StorageClass>(pIStack_7e8,1);
            if ((((local_9cc != StorageBuffer) && (local_9cc != Uniform)) &&
                (local_9cc != PushConstant)) &&
               (((local_9cc != Input && (local_9cc != Output)) &&
                (local_9cc != PhysicalStorageBuffer)))) {
              ValidationState_t::diag
                        (&local_ba8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                         (Instruction *)decoration_local);
              pDVar6 = DiagnosticStream::operator<<
                                 (&local_ba8,
                                  (char (*) [184])
                                  "FPRoundingMode decoration can be applied only to the Object operand of an OpStore in the StorageBuffer, PhysicalStorageBuffer, Uniform, PushConstant, Input, or Output Storage Classes."
                                 );
              vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
              DiagnosticStream::~DiagnosticStream(&local_ba8);
              return vstate_local._4_4_;
            }
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
      ::operator++(&__end2);
    }
    vstate_local._4_4_ = SPV_SUCCESS;
  }
  else {
    ValidationState_t::diag
              ((DiagnosticStream *)local_200,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
               (Instruction *)decoration_local);
    pDVar6 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)local_200,
                        (char (*) [112])
                        "FPRoundingMode decoration can be applied only to a width-only conversion instruction for floating-point object."
                       );
    vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_200);
  }
  return vstate_local._4_4_;
}

Assistant:

spv_result_t CheckFPRoundingModeForShaders(ValidationState_t& vstate,
                                           const Instruction& inst,
                                           const Decoration& decoration) {
  // Validates width-only conversion instruction for floating-point object
  // i.e., OpFConvert
  if (inst.opcode() != spv::Op::OpFConvert) {
    return vstate.diag(SPV_ERROR_INVALID_ID, &inst)
           << "FPRoundingMode decoration can be applied only to a "
              "width-only conversion instruction for floating-point "
              "object.";
  }

  if (spvIsVulkanEnv(vstate.context()->target_env)) {
    const auto mode = spv::FPRoundingMode(decoration.params()[0]);
    if ((mode != spv::FPRoundingMode::RTE) &&
        (mode != spv::FPRoundingMode::RTZ)) {
      return vstate.diag(SPV_ERROR_INVALID_ID, &inst)
             << vstate.VkErrorID(4675)
             << "In Vulkan, the FPRoundingMode mode must only by RTE or RTZ.";
    }
  }

  // Validates Object operand of an OpStore
  for (const auto& use : inst.uses()) {
    const auto store = use.first;
    if (store->opcode() == spv::Op::OpFConvert) continue;
    if (spvOpcodeIsDebug(store->opcode())) continue;
    if (store->IsNonSemantic()) continue;
    if (spvOpcodeIsDecoration(store->opcode())) continue;
    if (store->opcode() != spv::Op::OpStore) {
      return vstate.diag(SPV_ERROR_INVALID_ID, &inst)
             << "FPRoundingMode decoration can be applied only to the "
                "Object operand of an OpStore.";
    }

    if (use.second != 2) {
      return vstate.diag(SPV_ERROR_INVALID_ID, &inst)
             << "FPRoundingMode decoration can be applied only to the "
                "Object operand of an OpStore.";
    }

    const auto ptr_inst = vstate.FindDef(store->GetOperandAs<uint32_t>(0));
    const auto ptr_type = vstate.FindDef(ptr_inst->GetOperandAs<uint32_t>(0));

    const auto half_float_id = ptr_type->GetOperandAs<uint32_t>(2);
    if (!vstate.IsFloatScalarOrVectorType(half_float_id) ||
        vstate.GetBitWidth(half_float_id) != 16) {
      return vstate.diag(SPV_ERROR_INVALID_ID, &inst)
             << "FPRoundingMode decoration can be applied only to the "
                "Object operand of an OpStore storing through a pointer "
                "to "
                "a 16-bit floating-point scalar or vector object.";
    }

    // Validates storage class of the pointer to the OpStore
    const auto storage = ptr_type->GetOperandAs<spv::StorageClass>(1);
    if (storage != spv::StorageClass::StorageBuffer &&
        storage != spv::StorageClass::Uniform &&
        storage != spv::StorageClass::PushConstant &&
        storage != spv::StorageClass::Input &&
        storage != spv::StorageClass::Output &&
        storage != spv::StorageClass::PhysicalStorageBuffer) {
      return vstate.diag(SPV_ERROR_INVALID_ID, &inst)
             << "FPRoundingMode decoration can be applied only to the "
                "Object operand of an OpStore in the StorageBuffer, "
                "PhysicalStorageBuffer, Uniform, PushConstant, Input, or "
                "Output Storage Classes.";
    }
  }
  return SPV_SUCCESS;
}